

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Reader * __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::getParams
          (Reader *__return_storage_ptr__,MembraneCallContextHook *this)

{
  Reader reader;
  undefined4 uVar1;
  bool bVar2;
  CallContextHook *pCVar3;
  Reader *result;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  Reader *p;
  Reader *_p257;
  Fault local_20;
  Fault f;
  DebugExpression<bool> _kjCondition;
  MembraneCallContextHook *this_local;
  
  f.exception._6_1_ = (this->releasedParams ^ 0xffU) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
               ,0x100,FAILED,"!releasedParams","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    kj::_::Debug::Fault::fatal(&local_20);
  }
  p = kj::_::readMaybe<capnp::AnyPointer::Reader>(&this->params);
  if (p == (Reader *)0x0) {
    pCVar3 = kj::Own<capnp::CallContextHook,_std::nullptr_t>::operator->(&this->inner);
    (**pCVar3->_vptr_CallContextHook)(&local_60);
    reader.reader.capTable = (CapTableReader *)local_58;
    reader.reader.segment = (SegmentReader *)local_60;
    reader.reader.pointer = (WirePointer *)local_50;
    reader.reader._24_8_ = local_48;
    MembraneCapTableReader::imbue(__return_storage_ptr__,&this->paramsCapTable,reader);
    kj::Maybe<capnp::AnyPointer::Reader>::operator=(&this->params,__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->reader).segment = (p->reader).segment;
    (__return_storage_ptr__->reader).capTable = (p->reader).capTable;
    (__return_storage_ptr__->reader).pointer = (p->reader).pointer;
    uVar1 = *(undefined4 *)&(p->reader).field_0x1c;
    (__return_storage_ptr__->reader).nestingLimit = (p->reader).nestingLimit;
    *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Reader getParams() override {
    KJ_REQUIRE(!releasedParams);
    KJ_IF_SOME(p, params) {
      return p;
    } else {
      auto result = paramsCapTable.imbue(inner->getParams());
      params = result;
      return result;
    }